

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O2

dht_state * __thiscall
libtorrent::dht::dht_tracker::state(dht_state *__return_storage_ptr__,dht_tracker *this)

{
  _Base_ptr p_Var1;
  vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  nodes;
  undefined4 local_60;
  undefined8 local_50;
  undefined1 local_48 [16];
  code *local_38;
  
  (__return_storage_ptr__->nodes6).
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->nodes6).
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->nodes).
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->nodes).
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->nodes6).
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->nids).
  super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->nodes).
  super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->nids).
  super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->nids).
  super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (p_Var1 = (this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_nodes)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)::std::_Rb_tree_increment(p_Var1)) {
    aux::listen_socket_handle::get_local_endpoint
              ((endpoint *)&nodes,(listen_socket_handle *)(p_Var1 + 1));
    if ((short)nodes.
               super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
               ._M_impl.super__Vector_impl_data._M_start != 2) {
      local_48._0_8_ =
           nodes.
           super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_48._8_8_ =
           nodes.
           super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_38 = (code *)(ulong)(uint)local_60;
      local_50._4_4_ = (in4_addr_type)0;
    }
    else {
      local_48._0_8_ = (pointer)0x0;
      local_48._8_8_ = (pointer)0x0;
      local_38 = (code *)0x0;
      local_50._4_4_ =
           (in4_addr_type)
           (in4_addr_type)
           nodes.
           super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
           ._M_impl.super__Vector_impl_data._M_start._4_4_;
    }
    local_50._0_4_ =
         (uint)((short)nodes.
                       super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
                       ._M_impl.super__Vector_impl_data._M_start != 2);
    ::std::
    vector<std::pair<boost::asio::ip::address,libtorrent::digest32<160l>>,std::allocator<std::pair<boost::asio::ip::address,libtorrent::digest32<160l>>>>
    ::emplace_back<boost::asio::ip::address,libtorrent::digest32<160l>const&>
              ((vector<std::pair<boost::asio::ip::address,libtorrent::digest32<160l>>,std::allocator<std::pair<boost::asio::ip::address,libtorrent::digest32<160l>>>>
                *)__return_storage_ptr__,(address *)&local_50,(digest32<160L> *)&p_Var1[4]._M_left);
    nodes.
    super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    nodes.
    super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    nodes.
    super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._0_8_ = 0;
    local_38 = ::std::
               _Function_handler<void_(const_libtorrent::dht::node_entry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/kademlia/dht_tracker.cpp:587:29)>
               ::_M_invoke;
    local_48._8_8_ =
         ::std::
         _Function_handler<void_(const_libtorrent::dht::node_entry_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/kademlia/dht_tracker.cpp:587:29)>
         ::_M_manager;
    local_50 = &nodes;
    routing_table::for_each_node
              ((routing_table *)&p_Var1[5]._M_parent,
               (function<void_(const_libtorrent::dht::node_entry_&)> *)&local_50);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_50);
    ::std::
    vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>>
    ::
    insert<__gnu_cxx::__normal_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>*,std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>>>,void>
              ((vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>>
                *)&__return_storage_ptr__->nodes,
               (__return_storage_ptr__->nodes).
               super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (__normal_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_*,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
                )nodes.
                 super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_*,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>_>
                )nodes.
                 super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    ::std::
    _Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
    ::~_Vector_base(&nodes.
                     super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
                   );
  }
  return __return_storage_ptr__;
}

Assistant:

dht_state dht_tracker::state() const
	{
		dht_state ret;
		for (auto const& n : m_nodes)
		{
			// use the local rather than external address because if the user is behind NAT
			// we won't know the external IP on startup
			ret.nids.emplace_back(n.first.get_local_endpoint().address(), n.second.dht.nid());
			auto nodes = save_nodes(n.second.dht);
			ret.nodes.insert(ret.nodes.end(), nodes.begin(), nodes.end());
		}
		return ret;
	}